

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitPositionOperator,bool,false,true>
               (string_t *ldata,string_t *rdata,int *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  unsigned_long *puVar5;
  ulong uVar6;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  idx_t iVar23;
  ulong uVar24;
  char **ppcVar25;
  ulong uVar26;
  string_t substring;
  string_t substring_00;
  string_t substring_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar25 = &(ldata->value).pointer.ptr;
    for (iVar23 = 0; count != iVar23; iVar23 = iVar23 + 1) {
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar25 + -1);
      uVar4 = paVar1->length;
      uVar9 = paVar1->prefix[0];
      uVar12 = paVar1->prefix[1];
      uVar15 = paVar1->prefix[2];
      uVar18 = paVar1->prefix[3];
      substring_01.value.pointer.prefix[3] = uVar18;
      substring_01.value.pointer.prefix[2] = uVar15;
      substring_01.value.pointer.prefix[1] = uVar12;
      substring_01.value.pointer.prefix[0] = uVar9;
      substring_01.value.pointer.length = uVar4;
      substring_01.value.pointer.ptr = *ppcVar25;
      iVar19 = BitPositionOperator::Operation<duckdb::string_t,duckdb::string_t,int>
                         (substring_01,(string_t)(rdata->value).pointer);
      result_data[iVar23] = iVar19;
      ppcVar25 = ppcVar25 + 2;
    }
  }
  else {
    uVar24 = 0;
    for (uVar21 = 0; uVar21 != count + 0x3f >> 6; uVar21 = uVar21 + 1) {
      puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        uVar22 = uVar24 + 0x40;
        if (count <= uVar24 + 0x40) {
          uVar22 = count;
        }
LAB_01d7b160:
        ppcVar25 = &ldata[uVar24].value.pointer.ptr;
        for (; uVar20 = uVar24, uVar24 < uVar22; uVar24 = uVar24 + 1) {
          paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar25 + -1);
          uVar2 = paVar1->length;
          uVar7 = paVar1->prefix[0];
          uVar10 = paVar1->prefix[1];
          uVar13 = paVar1->prefix[2];
          uVar16 = paVar1->prefix[3];
          substring.value.pointer.prefix[3] = uVar16;
          substring.value.pointer.prefix[2] = uVar13;
          substring.value.pointer.prefix[1] = uVar10;
          substring.value.pointer.prefix[0] = uVar7;
          substring.value.pointer.length = uVar2;
          substring.value.pointer.ptr = *ppcVar25;
          iVar19 = BitPositionOperator::Operation<duckdb::string_t,duckdb::string_t,int>
                             (substring,(string_t)(rdata->value).pointer);
          result_data[uVar24] = iVar19;
          ppcVar25 = ppcVar25 + 2;
        }
      }
      else {
        uVar6 = puVar5[uVar21];
        uVar22 = uVar24 + 0x40;
        if (count <= uVar24 + 0x40) {
          uVar22 = count;
        }
        if (uVar6 == 0xffffffffffffffff) goto LAB_01d7b160;
        uVar20 = uVar22;
        if (uVar6 != 0) {
          ppcVar25 = &ldata[uVar24].value.pointer.ptr;
          for (uVar26 = 0; uVar20 = uVar26 + uVar24, uVar26 + uVar24 < uVar22; uVar26 = uVar26 + 1)
          {
            if ((uVar6 >> (uVar26 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar25 + -1);
              uVar3 = paVar1->length;
              uVar8 = paVar1->prefix[0];
              uVar11 = paVar1->prefix[1];
              uVar14 = paVar1->prefix[2];
              uVar17 = paVar1->prefix[3];
              substring_00.value.pointer.prefix[3] = uVar17;
              substring_00.value.pointer.prefix[2] = uVar14;
              substring_00.value.pointer.prefix[1] = uVar11;
              substring_00.value.pointer.prefix[0] = uVar8;
              substring_00.value.pointer.length = uVar3;
              substring_00.value.pointer.ptr = *ppcVar25;
              iVar19 = BitPositionOperator::Operation<duckdb::string_t,duckdb::string_t,int>
                                 (substring_00,(string_t)(rdata->value).pointer);
              result_data[uVar24 + uVar26] = iVar19;
            }
            ppcVar25 = ppcVar25 + 2;
          }
        }
      }
      uVar24 = uVar20;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}